

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cda-bench.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  node_pointer piVar1;
  undefined8 uVar2;
  char cVar3;
  clock_t cVar4;
  clock_t cVar5;
  ostream *poVar6;
  pointer ptVar7;
  _Base_ptr p_Var8;
  uint uVar9;
  _Base_ptr *pp_Var10;
  int iVar11;
  Function *pFVar12;
  BasicBlock *pBVar13;
  ulong uVar14;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it;
  pointer ptVar15;
  _Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false> F;
  BasicBlock *pBVar16;
  pointer pcVar17;
  long lVar18;
  long *plVar19;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  analyses;
  vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
  results;
  undefined1 local_328 [32];
  Value *d;
  uint local_2fc;
  LLVMControlDependenceAnalysis *local_2f8;
  BasicBlock *local_2f0;
  _Base_ptr local_2e8;
  _Base_ptr local_2e0;
  _Base_ptr local_2d8;
  pointer local_2d0;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it_2;
  _Head_base<0UL,_dg::LLVMControlDependenceAnalysisImpl_*,_false> local_2c0;
  iterator __end3;
  LLVMContext context;
  SlicerOptions options;
  
  setupStackTraceOnError(argc,argv);
  iVar11 = 1;
  parseSlicerOptions((int)&options,(char **)(ulong)(uint)argc,SUB81(argv,0),false);
  if (total_only[0x80] == '\x01') {
    analyses.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(analyses.
                           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
    llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::operator=
              ((opt<bool,false,llvm::cl::parser<bool>> *)quiet,(bool *)&analyses);
  }
  llvm::LLVMContext::LLVMContext(&context);
  parseModule((char *)&M,(LLVMContext *)"llvm-cda-bench",(SlicerOptions *)&context);
  if ((__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)
      M._M_t.super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
      super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
      super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>)0x0) {
    if (fun_info_only[0x80] == '\x01') {
      plVar19 = (long *)((long)M._M_t.
                               super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>
                               .super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl + 0x20);
      while (lVar18 = *plVar19,
            lVar18 != (long)M._M_t.
                            super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>
                            .super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl + 0x18) {
        pFVar12 = (Function *)(lVar18 + -0x38);
        if (lVar18 == 0) {
          pFVar12 = (Function *)0x0;
        }
        cVar3 = llvm::GlobalValue::isDeclaration();
        if (cVar3 == '\0') {
          dumpFunStats(pFVar12);
        }
        plVar19 = (long *)(lVar18 + 8);
      }
    }
    else {
      analyses.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      analyses.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      analyses.
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (scd[0x80] == '\x01') {
        options.dgOptions.CDAOptions.super_ControlDependenceAnalysisOptions.algorithm = STANDARD;
        createAnalysis((Module *)&results,
                       (LLVMControlDependenceAnalysisOptions *)
                       M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
        local_328._0_4_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&analyses,(char (*) [4])0x10f2e8,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)&results,(int *)local_328);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)&results);
      }
      if (ntscd[0x80] == '\x01') {
        options.dgOptions.CDAOptions.super_ControlDependenceAnalysisOptions.algorithm = NTSCD;
        createAnalysis((Module *)&results,
                       (LLVMControlDependenceAnalysisOptions *)
                       M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
        local_328._0_4_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[6],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&analyses,(char (*) [6])0x10f2e6,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)&results,(int *)local_328);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)&results);
      }
      if (ntscd2[0x80] == '\x01') {
        options.dgOptions.CDAOptions.super_ControlDependenceAnalysisOptions.algorithm = NTSCD2;
        createAnalysis((Module *)&results,
                       (LLVMControlDependenceAnalysisOptions *)
                       M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
        local_328._0_4_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[7],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&analyses,(char (*) [7])"ntscd2",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)&results,(int *)local_328);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)&results);
      }
      if (ntscd_ranganath[0x80] == '\x01') {
        options.dgOptions.CDAOptions.super_ControlDependenceAnalysisOptions.algorithm =
             NTSCD_RANGANATH;
        createAnalysis((Module *)&results,
                       (LLVMControlDependenceAnalysisOptions *)
                       M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
        local_328._0_4_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[16],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&analyses,(char (*) [16])"ntscd-ranganath",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)&results,(int *)local_328);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)&results);
      }
      if (ntscd_ranganath_wrong[0x80] == '\x01') {
        options.dgOptions.CDAOptions.super_ControlDependenceAnalysisOptions.algorithm =
             NTSCD_RANGANATH_ORIG;
        createAnalysis((Module *)&results,
                       (LLVMControlDependenceAnalysisOptions *)
                       M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
        local_328._0_4_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[22],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&analyses,(char (*) [22])"ntscd-ranganath-wrong",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)&results,(int *)local_328);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)&results);
      }
      if (ntscd_legacy[0x80] == '\x01') {
        options.dgOptions.CDAOptions.super_ControlDependenceAnalysisOptions.algorithm = NTSCD_LEGACY
        ;
        createAnalysis((Module *)&results,
                       (LLVMControlDependenceAnalysisOptions *)
                       M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
        local_328._0_4_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[13],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&analyses,(char (*) [13])"ntscd-legacy",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)&results,(int *)local_328);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)&results);
      }
      if (dod[0x80] == '\x01') {
        options.dgOptions.CDAOptions.super_ControlDependenceAnalysisOptions.algorithm = DOD;
        createAnalysis((Module *)&results,
                       (LLVMControlDependenceAnalysisOptions *)
                       M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
        local_328._0_4_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&analyses,(char (*) [4])"dod",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)&results,(int *)local_328);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)&results);
      }
      if (dod_ranganath[0x80] == '\x01') {
        options.dgOptions.CDAOptions.super_ControlDependenceAnalysisOptions.algorithm =
             DOD_RANGANATH;
        createAnalysis((Module *)&results,
                       (LLVMControlDependenceAnalysisOptions *)
                       M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
        local_328._0_4_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[14],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&analyses,(char (*) [14])"dod-ranganath",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)&results,(int *)local_328);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)&results);
      }
      if (dod_ntscd[0x80] == '\x01') {
        options.dgOptions.CDAOptions.super_ControlDependenceAnalysisOptions.algorithm = DODNTSCD;
        createAnalysis((Module *)&results,
                       (LLVMControlDependenceAnalysisOptions *)
                       M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
        local_328._0_4_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[10],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&analyses,(char (*) [10])"dod+ntscd",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)&results,(int *)local_328);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)&results);
      }
      if (scc[0x80] == '\x01') {
        options.dgOptions.CDAOptions.super_ControlDependenceAnalysisOptions.algorithm = STRONG_CC;
        createAnalysis((Module *)&results,
                       (LLVMControlDependenceAnalysisOptions *)
                       M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl);
        local_328._0_4_ = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
                    *)&analyses,(char (*) [4])"scc",
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)&results,(int *)local_328);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)&results);
      }
      if (analyses.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          analyses.
          super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator<<((ostream *)&std::cerr,
                        "Warning: No analysis to run specified, dumping just info about funs\n");
      }
      pBVar13 = (BasicBlock *)
                ((long)M._M_t.
                       super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>.
                       super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl + 0x18);
      local_328._24_8_ = pBVar13;
      for (pBVar16 = (BasicBlock *)
                     ((long)M._M_t.
                            super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>
                            .super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl + 0x20);
          pBVar16 = *(BasicBlock **)pBVar16, pBVar16 != pBVar13; pBVar16 = pBVar16 + 8) {
        pFVar12 = (Function *)(pBVar16 + -0x38);
        if (pBVar16 == (BasicBlock *)0x0) {
          pFVar12 = (Function *)0x0;
        }
        cVar3 = llvm::GlobalValue::isDeclaration();
        if (cVar3 == '\0') {
          ptVar15 = analyses.
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ptVar7 = analyses.
                   super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (quiet[0x80] == '\0') {
            dumpFunStats(pFVar12);
            std::operator<<((ostream *)&std::cout,"Elapsed time: \n");
            ptVar15 = analyses.
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ptVar7 = analyses.
                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          for (; pBVar13 = (BasicBlock *)local_328._24_8_, ptVar15 != ptVar7; ptVar15 = ptVar15 + 1)
          {
            cVar4 = clock();
            dg::LLVMControlDependenceAnalysis::compute
                      ((ptVar15->
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                       ).
                       super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                       .
                       super__Head_base<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_false>
                       ._M_head_impl._M_t.
                       super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>.
                       _M_head_impl,pFVar12);
            cVar5 = clock();
            (ptVar15->
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
            ).
            super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
            .super__Tuple_impl<2UL,_unsigned_long>.super__Head_base<2UL,_unsigned_long,_false>.
            _M_head_impl = (ptVar15->
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                           ).
                           super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                           .super__Tuple_impl<2UL,_unsigned_long>.
                           super__Head_base<2UL,_unsigned_long,_false>._M_head_impl +
                           (cVar5 - cVar4);
            if (quiet[0x80] == '\0') {
              poVar6 = std::operator<<((ostream *)&std::cout,"  ");
              poVar6 = std::operator<<(poVar6,(string *)
                                              &(ptVar15->
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                               ).
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                      );
              poVar6 = std::operator<<(poVar6,": ");
              poVar6 = (ostream *)
                       std::ostream::operator<<((ostream *)poVar6,(float)(cVar5 - cVar4) / 1e+06);
              poVar6 = std::operator<<(poVar6," s (");
              poVar6 = std::ostream::_M_insert<long>((long)poVar6);
              std::operator<<(poVar6," ticks)\n");
            }
          }
          if (quiet[0x80] == '\0') {
            poVar6 = std::operator<<((ostream *)&std::cout,"-----");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
        }
      }
      if ((quiet[0x80] == '\0') || (total_only[0x80] == '\x01')) {
        std::operator<<((ostream *)&std::cout,"Total elapsed time:\n");
        ptVar7 = analyses.
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ptVar15 = analyses.
                       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; ptVar15 != ptVar7;
            ptVar15 = ptVar15 + 1) {
          poVar6 = std::operator<<((ostream *)&std::cout,"  ");
          poVar6 = std::operator<<(poVar6,(string *)
                                          &(ptVar15->
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                           ).
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                  );
          poVar6 = std::operator<<(poVar6,": ");
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)poVar6,
                              (float)(ptVar15->
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                     ).
                                     super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                     .super__Tuple_impl<2UL,_unsigned_long>.
                                     super__Head_base<2UL,_unsigned_long,_false>._M_head_impl /
                              1e+06);
          poVar6 = std::operator<<(poVar6," s (");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(poVar6," ticks)");
          std::endl<char,std::char_traits<char>>(poVar6);
        }
      }
      if (compare[0x80] == '\x01') {
        std::operator<<((ostream *)&std::cout,"\n ==== Comparison ====\n");
        local_2e8 = (_Base_ptr)
                    ((long)M._M_t.
                           super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                           _M_t.
                           super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>
                           .super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl + 0x18);
        pp_Var10 = (_Base_ptr *)
                   ((long)M._M_t.
                          super___uniq_ptr_impl<llvm::Module,_std::default_delete<llvm::Module>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_llvm::Module_*,_std::default_delete<llvm::Module>_>
                          .super__Head_base<0UL,_llvm::Module_*,_false>._M_head_impl + 0x20);
        while (p_Var8 = *pp_Var10, p_Var8 != local_2e8) {
          F._M_head_impl = (LLVMControlDependenceAnalysisImpl *)&p_Var8[-2]._M_parent;
          if (p_Var8 == (_Base_ptr)0x0) {
            F._M_head_impl = (LLVMControlDependenceAnalysisImpl *)0x0;
          }
          local_2e0 = p_Var8;
          cVar3 = llvm::GlobalValue::isDeclaration();
          if (cVar3 == '\0') {
            results.
            super__Vector_base<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            results.
            super__Vector_base<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            results.
            super__Vector_base<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            std::
            vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
            ::resize(&results,((long)analyses.
                                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)analyses.
                                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x30);
            local_2d0 = analyses.
                        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            local_2d8 = (_Base_ptr)(F._M_head_impl + 0x50);
            __end3.NodePtr = (node_pointer)(F._M_head_impl + 0x48);
            uVar9 = 0;
            ptVar7 = analyses.
                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_2c0._M_head_impl = F._M_head_impl;
            while (ptVar7 != local_2d0) {
              local_2f8 = (ptVar7->
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                          ).
                          super__Tuple_impl<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                          .
                          super__Head_base<1UL,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_false>
                          ._M_head_impl._M_t.
                          super___uniq_ptr_impl<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_dg::LLVMControlDependenceAnalysis_*,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                          .super__Head_base<0UL,_dg::LLVMControlDependenceAnalysis_*,_false>.
                          _M_head_impl;
              p_Var8 = local_2d8;
              local_2fc = uVar9;
              it_2 = ptVar7;
              while( true ) {
                piVar1 = *(node_pointer *)p_Var8;
                if (piVar1 == __end3.NodePtr) break;
                pBVar16 = (BasicBlock *)&piVar1[-2].super_node_base_type.Next;
                if (piVar1 == (node_pointer)0x0) {
                  pBVar16 = (BasicBlock *)0x0;
                }
                dg::LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>
                          ((LLVMControlDependenceAnalysis *)local_328,(BasicBlock *)local_2f8);
                uVar2 = local_328._8_8_;
                for (pcVar17 = (pointer)CONCAT44(local_328._4_4_,local_328._0_4_);
                    pcVar17 != (pointer)uVar2; pcVar17 = pcVar17 + 8) {
                  d = *(Value **)pcVar17;
                  local_2f0 = pBVar16;
                  std::
                  _Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                  ::_M_emplace_unique<llvm::Value*&,llvm::BasicBlock*>
                            ((_Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                              *)(results.
                                 super__Vector_base<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar9),&d,&local_2f0);
                }
                std::_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~_Vector_base
                          ((_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)local_328)
                ;
                pBVar13 = pBVar16 + 0x30;
                local_328._24_8_ = pBVar16 + 0x28;
                while( true ) {
                  pBVar13 = *(BasicBlock **)pBVar13;
                  if (pBVar13 == (BasicBlock *)local_328._24_8_) break;
                  pBVar16 = pBVar13 + -0x18;
                  if (pBVar13 == (BasicBlock *)0x0) {
                    pBVar16 = (BasicBlock *)0x0;
                  }
                  dg::LLVMControlDependenceAnalysis::_getDependencies<llvm::Instruction_const*>
                            ((LLVMControlDependenceAnalysis *)local_328,(Instruction *)local_2f8);
                  uVar2 = local_328._8_8_;
                  for (pcVar17 = (pointer)CONCAT44(local_328._4_4_,local_328._0_4_);
                      pcVar17 != (pointer)uVar2; pcVar17 = pcVar17 + 8) {
                    d = *(Value **)pcVar17;
                    local_2f0 = pBVar16;
                    std::
                    _Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                    ::_M_emplace_unique<llvm::Value*&,llvm::Instruction*>
                              ((_Rb_tree<std::pair<llvm::Value_const*,llvm::Value_const*>,std::pair<llvm::Value_const*,llvm::Value_const*>,std::_Identity<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                                *)(results.
                                   super__Vector_base<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar9),&d,
                               (Instruction **)&local_2f0);
                  }
                  std::_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~_Vector_base
                            ((_Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                             local_328);
                  pBVar13 = pBVar13 + 8;
                }
                p_Var8 = (_Base_ptr)&(piVar1->super_node_base_type).Next;
                F._M_head_impl = local_2c0._M_head_impl;
              }
              uVar9 = local_2fc + 1;
              ptVar7 = it_2 + 1;
            }
            for (uVar9 = 0; uVar14 = (ulong)uVar9,
                uVar14 < (ulong)(((long)results.
                                        super__Vector_base<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)results.
                                       super__Vector_base<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0x30);
                uVar9 = uVar9 + 1) {
              for (lVar18 = 0; uVar14 * 0x30 - lVar18 != 0; lVar18 = lVar18 + 0x30) {
                compareResults(results.
                               super__Vector_base<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar14,
                               (set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>
                                *)(&((results.
                                      super__Vector_base<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.
                                    field_0x0 + lVar18),
                               &analyses.
                                super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar14].
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                ._M_head_impl,
                               (string *)
                               ((long)&((analyses.
                                         super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                       ).
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                       ._M_head_impl._M_dataplus._M_p + lVar18),
                               (Function *)F._M_head_impl);
              }
            }
            std::
            vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
            ::~vector(&results);
          }
          pp_Var10 = &local_2e0->_M_parent;
        }
      }
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ::~vector(&analyses);
    }
    iVar11 = 0;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr(&M);
  llvm::LLVMContext::~LLVMContext(&context);
  SlicerOptions::~SlicerOptions(&options);
  return iVar11;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    if (total_only) {
        quiet = true;
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-cda-bench", context, options);
    if (!M)
        return 1;

    if (fun_info_only) {
        for (auto &F : *M) {
            if (F.isDeclaration()) {
                continue;
            }

            dumpFunStats(F);
        }
        return 0;
    }

    std::vector<
            std::tuple<std::string,
                       std::unique_ptr<LLVMControlDependenceAnalysis>, size_t>>
            analyses;

    clock_t start, end, elapsed;
    auto &opts = options.dgOptions.CDAOptions;
    if (scd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::STANDARD;
        analyses.emplace_back("scd", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD;
        analyses.emplace_back("ntscd", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd2) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD2;
        analyses.emplace_back("ntscd2", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd_ranganath) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                NTSCD_RANGANATH;
        analyses.emplace_back("ntscd-ranganath", createAnalysis(M.get(), opts),
                              0);
    }
    if (ntscd_ranganath_wrong) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                NTSCD_RANGANATH_ORIG;
        analyses.emplace_back("ntscd-ranganath-wrong",
                              createAnalysis(M.get(), opts), 0);
    }
    if (ntscd_legacy) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD_LEGACY;
        analyses.emplace_back("ntscd-legacy", createAnalysis(M.get(), opts), 0);
    }
    if (dod) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::DOD;
        analyses.emplace_back("dod", createAnalysis(M.get(), opts), 0);
    }
    if (dod_ranganath) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                DOD_RANGANATH;
        analyses.emplace_back("dod-ranganath", createAnalysis(M.get(), opts),
                              0);
    }
    if (dod_ntscd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::DODNTSCD;
        analyses.emplace_back("dod+ntscd", createAnalysis(M.get(), opts), 0);
    }
    if (scc) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::STRONG_CC;
        analyses.emplace_back("scc", createAnalysis(M.get(), opts), 0);
    }

    if (analyses.empty()) {
        std::cerr << "Warning: No analysis to run specified, "
                     "dumping just info about funs\n";
    }

    for (auto &F : *M) {
        if (F.isDeclaration()) {
            continue;
        }

        if (!quiet) {
            dumpFunStats(F);
            std::cout << "Elapsed time: \n";
        }

        for (auto &it : analyses) {
            start = clock();
            std::get<1>(it)->compute(&F); // compute all the information
            end = clock();
            elapsed = end - start;
            std::get<2>(it) += elapsed;
            if (!quiet) {
                std::cout << "  " << std::get<0>(it) << ": "
                          << static_cast<float>(elapsed) / CLOCKS_PER_SEC
                          << " s (" << elapsed << " ticks)\n";
            }
        }
        if (!quiet) {
            std::cout << "-----" << std::endl;
        }
    }

    if (!quiet || total_only) {
        std::cout << "Total elapsed time:\n";
        for (auto &it : analyses) {
            std::cout << "  " << std::get<0>(it) << ": "
                      << static_cast<float>(std::get<2>(it)) / CLOCKS_PER_SEC
                      << " s (" << std::get<2>(it) << " ticks)" << std::endl;
        }
    }

    // compare the results if requested
    if (!compare)
        return 0;

    std::cout << "\n ==== Comparison ====\n";
    for (auto &F : *M) {
        if (F.isDeclaration()) {
            continue;
        }

        // not very efficient...
        std::vector<
                std::set<std::pair<const llvm::Value *, const llvm::Value *>>>
                results;
        results.resize(analyses.size());
        unsigned n = 0;
        for (auto &it : analyses) {
            auto *cda = std::get<1>(it).get();
            for (auto &B : F) {
                for (auto *d : cda->getDependencies(&B)) {
                    results[n].emplace(d, &B);
                }

                for (auto &I : B) {
                    for (auto *d : cda->getDependencies(&I)) {
                        results[n].emplace(d, &I);
                    }
                }
            }

            ++n;
        }

        for (n = 0; n < results.size(); ++n) {
            for (unsigned m = 0; m < n; ++m) {
                compareResults(results[n], results[m], std::get<0>(analyses[n]),
                               std::get<0>(analyses[m]), F);
            }
        }
    }

    return 0;
}